

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3RowSetTest(RowSet *pRowSet,int iBatch,sqlite3_int64 iRowid)

{
  RowSetEntry **ppRVar1;
  RowSetEntry *pRVar2;
  RowSetEntry *pRVar3;
  RowSetEntry *pRVar4;
  RowSetEntry **ppRVar5;
  long lVar6;
  RowSetEntry *pRVar7;
  RowSetEntry *pAux;
  RowSetEntry *pTail;
  RowSetEntry head;
  RowSetEntry *local_58;
  RowSetEntry *local_50;
  RowSetEntry local_48;
  
  if (pRowSet->iBatch != iBatch) {
    pRVar2 = pRowSet->pEntry;
    if (pRVar2 != (RowSetEntry *)0x0) {
      ppRVar5 = &pRowSet->pForest;
      if ((pRowSet->rsFlags & 1) == 0) {
        pRVar2 = rowSetEntrySort(pRVar2);
      }
      pRVar3 = *ppRVar5;
      if (pRVar3 != (RowSetEntry *)0x0) {
        do {
          if (pRVar3->pLeft == (RowSetEntry *)0x0) {
            pRVar2 = rowSetListToTree(pRVar2);
            pRVar3->pLeft = pRVar2;
            goto LAB_00144d32;
          }
          ppRVar5 = &pRVar3->pRight;
          rowSetTreeToList(pRVar3->pLeft,&local_58,&local_50);
          pRVar3->pLeft = (RowSetEntry *)0x0;
          pRVar3 = local_58;
          pRVar4 = &local_48;
          do {
            lVar6 = pRVar3->v;
            while (pRVar2->v < lVar6) {
              pRVar4->pRight = pRVar2;
              ppRVar1 = &pRVar2->pRight;
              pRVar4 = pRVar2;
              pRVar2 = *ppRVar1;
              pRVar7 = pRVar3;
              if (*ppRVar1 == (RowSetEntry *)0x0) goto LAB_00144ceb;
            }
            if (lVar6 < pRVar2->v) {
              pRVar4->pRight = pRVar3;
              pRVar4 = pRVar3;
            }
            pRVar3 = pRVar3->pRight;
            pRVar7 = pRVar2;
          } while (pRVar3 != (RowSetEntry *)0x0);
LAB_00144ceb:
          pRVar4->pRight = pRVar7;
          pRVar3 = *ppRVar5;
          pRVar2 = local_48.pRight;
        } while (pRVar3 != (RowSetEntry *)0x0);
      }
      pRVar3 = rowSetEntryAlloc(pRowSet);
      *ppRVar5 = pRVar3;
      if (pRVar3 != (RowSetEntry *)0x0) {
        pRVar3->v = 0;
        pRVar3->pRight = (RowSetEntry *)0x0;
        pRVar2 = rowSetListToTree(pRVar2);
        pRVar3->pLeft = pRVar2;
      }
LAB_00144d32:
      pRowSet->pEntry = (RowSetEntry *)0x0;
      pRowSet->pLast = (RowSetEntry *)0x0;
      *(byte *)&pRowSet->rsFlags = (byte)pRowSet->rsFlags | 1;
    }
    pRowSet->iBatch = iBatch;
  }
  pRVar2 = pRowSet->pForest;
  do {
    if (pRVar2 == (RowSetEntry *)0x0) {
      return 0;
    }
    for (pRVar3 = pRVar2->pLeft; pRVar3 != (RowSetEntry *)0x0;
        pRVar3 = *(RowSetEntry **)((long)&pRVar3->v + lVar6)) {
      lVar6 = 8;
      if ((iRowid <= pRVar3->v) && (lVar6 = 0x10, pRVar3->v <= iRowid)) {
        return 1;
      }
    }
    pRVar2 = pRVar2->pRight;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3RowSetTest(RowSet *pRowSet, int iBatch, sqlite3_int64 iRowid){
  struct RowSetEntry *p, *pTree;

  /* This routine is never called after sqlite3RowSetNext() */
  assert( pRowSet!=0 && (pRowSet->rsFlags & ROWSET_NEXT)==0 );

  /* Sort entries into the forest on the first test of a new batch.
  ** To save unnecessary work, only do this when the batch number changes.
  */
  if( iBatch!=pRowSet->iBatch ){  /*OPTIMIZATION-IF-FALSE*/
    p = pRowSet->pEntry;
    if( p ){
      struct RowSetEntry **ppPrevTree = &pRowSet->pForest;
      if( (pRowSet->rsFlags & ROWSET_SORTED)==0 ){ /*OPTIMIZATION-IF-FALSE*/
        /* Only sort the current set of entries if they need it */
        p = rowSetEntrySort(p);
      }
      for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
        ppPrevTree = &pTree->pRight;
        if( pTree->pLeft==0 ){
          pTree->pLeft = rowSetListToTree(p);
          break;
        }else{
          struct RowSetEntry *pAux, *pTail;
          rowSetTreeToList(pTree->pLeft, &pAux, &pTail);
          pTree->pLeft = 0;
          p = rowSetEntryMerge(pAux, p);
        }
      }
      if( pTree==0 ){
        *ppPrevTree = pTree = rowSetEntryAlloc(pRowSet);
        if( pTree ){
          pTree->v = 0;
          pTree->pRight = 0;
          pTree->pLeft = rowSetListToTree(p);
        }
      }
      pRowSet->pEntry = 0;
      pRowSet->pLast = 0;
      pRowSet->rsFlags |= ROWSET_SORTED;
    }
    pRowSet->iBatch = iBatch;
  }

  /* Test to see if the iRowid value appears anywhere in the forest.
  ** Return 1 if it does and 0 if not.
  */
  for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
    p = pTree->pLeft;
    while( p ){
      if( p->v<iRowid ){
        p = p->pRight;
      }else if( p->v>iRowid ){
        p = p->pLeft;
      }else{
        return 1;
      }
    }
  }
  return 0;
}